

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

int32 ps_lattice_posterior(ps_lattice_t *dag,ngram_model_t *lmset,float32 ascale)

{
  s3wid_t w;
  int iVar1;
  int32 iVar2;
  bool bVar3;
  bool bVar4;
  latlink_list_t *local_68;
  ps_latlink_t *prev_link;
  int16 to_is_fil;
  int16 from_is_fil;
  int32 to_wid;
  int32 from_wid;
  int32 n_used;
  int32 bprob;
  int32 bestescr;
  ps_latlink_t *bestend;
  latlink_list_t *x;
  ps_latlink_t *link;
  ps_latnode_t *node;
  logmath_t *lmath;
  ngram_model_t *pnStack_18;
  float32 ascale_local;
  ngram_model_t *lmset_local;
  ps_lattice_t *dag_local;
  
  node = (ps_latnode_t *)dag->lmath;
  lmath._4_4_ = ascale;
  pnStack_18 = lmset;
  lmset_local = (ngram_model_t *)dag;
  for (link = (ps_latlink_t *)dag->nodes; link != (ps_latlink_t *)0x0; link = link[1].best_prev) {
    for (bestend = *(ps_latlink_t **)&link->beta; bestend != (ps_latlink_t *)0x0;
        bestend = (ps_latlink_t *)bestend->to) {
      iVar1 = logmath_get_zero((logmath_t *)node);
      *(int *)&bestend->from->exits = iVar1;
    }
  }
  _bprob = (ps_latlink_t *)0x0;
  n_used = -0x80000000;
  x = (latlink_list_t *)
      ps_lattice_reverse_edges((ps_lattice_t *)lmset_local,(ps_latnode_t *)0x0,(ps_latnode_t *)0x0);
  do {
    if (x == (latlink_list_t *)0x0) {
      iVar2 = ps_lattice_joint((ps_lattice_t *)lmset_local,_bprob,lmath._4_4_);
      return iVar2 - *(int *)((long)&lmset_local->tmp_wids + 4);
    }
    _to_is_fil = *(s3wid_t *)&x->link->to;
    w = *(s3wid_t *)&x->next->next;
    iVar1 = dict_filler_word(*(dict_t **)&lmset_local->n,_to_is_fil);
    bVar3 = false;
    if (iVar1 != 0) {
      bVar3 = x->link != *(ps_latlink_t **)&lmset_local->log_zero;
    }
    iVar1 = dict_filler_word(*(dict_t **)&lmset_local->n,w);
    bVar4 = false;
    if (iVar1 != 0) {
      bVar4 = x->next != (latlink_list_s *)lmset_local->word_str;
    }
    if ((!bVar4) && (bVar3)) {
      local_68 = x;
      do {
        if (local_68[1].link == (ps_latlink_t *)0x0) goto LAB_0011557c;
        local_68 = (latlink_list_t *)local_68[1].link;
        _to_is_fil = *(s3wid_t *)&local_68->link->to;
        iVar1 = dict_filler_word(*(dict_t **)&lmset_local->n,_to_is_fil);
      } while ((iVar1 != 0) && (local_68->link != *(ps_latlink_t **)&lmset_local->log_zero));
      bVar3 = false;
    }
LAB_0011557c:
    if (((pnStack_18 == (ngram_model_t *)0x0) || (bVar3)) || (bVar4)) {
      from_wid = 0;
    }
    else {
      from_wid = ngram_ng_prob(pnStack_18,w,(int32 *)&to_is_fil,1,&to_wid);
    }
    if (x->next == (latlink_list_s *)lmset_local->word_str) {
      if (n_used < *(int *)((long)&x[1].next + 4)) {
        n_used = *(int32 *)((long)&x[1].next + 4);
        _bprob = (ps_latlink_t *)x;
      }
      *(int32 *)&x[2].next =
           from_wid + (int)((float)(*(int *)&lmset_local->tmp_wids << 10) * (float)lmath._4_4_);
    }
    else {
      for (bestend = (ps_latlink_t *)x->next[2].next; bestend != (ps_latlink_t *)0x0;
          bestend = (ps_latlink_t *)bestend->to) {
        iVar1 = logmath_add((logmath_t *)node,*(int *)&x[2].next,
                            *(int *)&bestend->from->exits + from_wid +
                            (int)((float)(*(int *)&bestend->from->reachable << 10) *
                                 (float)lmath._4_4_));
        *(int *)&x[2].next = iVar1;
      }
    }
    x = (latlink_list_t *)ps_lattice_reverse_next((ps_lattice_t *)lmset_local,(ps_latnode_t *)0x0);
  } while( true );
}

Assistant:

int32
ps_lattice_posterior(ps_lattice_t *dag, ngram_model_t *lmset,
                     float32 ascale)
{
    logmath_t *lmath;
    ps_latnode_t *node;
    ps_latlink_t *link;
    latlink_list_t *x;
    ps_latlink_t *bestend;
    int32 bestescr;

    lmath = dag->lmath;

    /* Reset all betas to zero. */
    for (node = dag->nodes; node; node = node->next) {
        for (x = node->exits; x; x = x->next) {
            x->link->beta = logmath_get_zero(lmath);
        }
    }

    bestend = NULL;
    bestescr = MAX_NEG_INT32;
    /* Accumulate backward probabilities for all links. */
    for (link = ps_lattice_reverse_edges(dag, NULL, NULL);
         link; link = ps_lattice_reverse_next(dag, NULL)) {
        int32 bprob, n_used;
        int32 from_wid, to_wid;
        int16 from_is_fil, to_is_fil;

        from_wid = link->from->basewid;
        to_wid = link->to->basewid;
        from_is_fil = dict_filler_word(dag->dict, from_wid) && link->from != dag->start;
        to_is_fil = dict_filler_word(dag->dict, to_wid) && link->to != dag->end;

        /* Find word predecessor if from-word is filler */
        if (!to_is_fil && from_is_fil) {
            ps_latlink_t *prev_link = link;
            while (prev_link->best_prev != NULL) {
                prev_link = prev_link->best_prev;
                from_wid = prev_link->from->basewid;
                if (!dict_filler_word(dag->dict, from_wid) || prev_link->from == dag->start) {
                    from_is_fil = FALSE;
                    break;
                }
            }
        }

        /* Calculate LM probability. */
        if (lmset && !from_is_fil && !to_is_fil)
            bprob = ngram_ng_prob(lmset, to_wid, &from_wid, 1, &n_used);
        else
            bprob = 0;

        if (link->to == dag->end) {
            /* Track the best path - we will backtrace in order to
               calculate the unscaled joint probability for sentence
               posterior. */
            if (link->path_scr BETTER_THAN bestescr) {
                bestescr = link->path_scr;
                bestend = link;
            }
            /* Imaginary exit link from final node has beta = 1.0 */
            link->beta = bprob + (int32)((dag->final_node_ascr << SENSCR_SHIFT) * ascale);
        }
        else {
            /* Update beta from all outgoing betas. */
            for (x = link->to->exits; x; x = x->next) {
                link->beta = logmath_add(lmath, link->beta,
                                         x->link->beta + bprob
                                         + (int)((x->link->ascr << SENSCR_SHIFT) * ascale));
            }
        }
    }

    /* Return P(S|O) = P(O,S)/P(O) */
    return ps_lattice_joint(dag, bestend, ascale) - dag->norm;
}